

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomUpEvaluation.hpp
# Opt level: O0

tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:509:15),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:520:15),_Lib::Memo::None<Kernel::AutoDerefTermSpec,_Kernel::TermList>,_std::tuple<>,_std::tuple<>_>
* __thiscall
Lib::
BottomUpEvaluation<Kernel::AutoDerefTermSpec,_Kernel::TermList,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.cpp:509:15),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.cpp:520:15),_Lib::Memo::None<Kernel::AutoDerefTermSpec,_Kernel::TermList>,_std::tuple<>_>
::intoTuple(BottomUpEvaluation<Kernel::AutoDerefTermSpec,_Kernel::TermList,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:509:15),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:520:15),_Lib::Memo::None<Kernel::AutoDerefTermSpec,_Kernel::TermList>,_std::tuple<>_>
            *this)

{
  anon_class_8_1_8991fb9c __elements;
  tuple<> *in_RSI;
  tuple<> *in_RDI;
  tuple<> *__elements_2;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffe0;
  tuple<> *this_00;
  
  __elements_2 = in_RDI;
  this_00 = in_RSI;
  __elements = move_if_value<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:509:15),_true>
                         ((anon_class_8_1_8991fb9c *)(in_RSI + 8));
  move_if_value<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:520:15),_true>
            ((anon_class_1_0_00000001 *)(in_RSI + 0x10));
  move_if_value<Lib::Memo::None<Kernel::AutoDerefTermSpec,_Kernel::TermList>,_true>
            ((None<Kernel::AutoDerefTermSpec,_Kernel::TermList> *)(in_RSI + 0x11));
  move_if_value<std::tuple<>,_true>(in_RSI + 0x12);
  std::make_tuple<>();
  std::
  tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.cpp:509:15),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.cpp:520:15),_Lib::Memo::None<Kernel::AutoDerefTermSpec,_Kernel::TermList>,_std::tuple<>,_std::tuple<>_>
  ::
  tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:509:15),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:520:15),_Lib::Memo::None<Kernel::AutoDerefTermSpec,_Kernel::TermList>,_std::tuple<>,_std::tuple<>,_true,_true>
            ((tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:509:15),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:520:15),_Lib::Memo::None<Kernel::AutoDerefTermSpec,_Kernel::TermList>,_std::tuple<>,_std::tuple<>_>
              *)this_00,(anon_class_8_1_8991fb9c *)__elements.this,in_stack_ffffffffffffffe0,
             (None<Kernel::AutoDerefTermSpec,_Kernel::TermList> *)__elements_2,in_RDI,in_RSI);
  return (tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:509:15),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_cpp:520:15),_Lib::Memo::None<Kernel::AutoDerefTermSpec,_Kernel::TermList>,_std::tuple<>,_std::tuple<>_>
          *)(None<Kernel::AutoDerefTermSpec,_Kernel::TermList> *)__elements_2;
}

Assistant:

auto intoTuple() &&
  { return std::tuple<
#                                       define foreach(idx, Type, name, defaultVal)       \
             Type,
                                        FOR_FIELD(foreach)
#                                       undef foreach
             std::tuple<>
    >(
#                                       define foreach(idx, Type, name, defaultVal)       \
             move_if_value<Type>(_ ## name),
                                        FOR_FIELD(foreach)
#                                       undef foreach
             std::make_tuple()); }